

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window_00;
  ImVec2 IVar3;
  bool local_55;
  bool held;
  bool local_4a;
  bool hovered;
  bool pressed;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiButtonFlags flags_local;
  bool *out_held_local;
  bool *out_hovered_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  window_00 = GetCurrentWindow();
  if ((flags & 0x80U) == 0) {
    g._4_4_ = flags;
    if ((flags & 0x1eU) == 0) {
      g._4_4_ = flags | 2;
    }
    bb_local._7_1_ = false;
    local_4a = IsHovered(bb,id,(g._4_4_ & 0x20) != 0);
    if ((local_4a) &&
       ((SetHoveredID(id), (g._4_4_ & 0x200) == 0 ||
        (((((pIVar1->IO).KeyCtrl & 1U) == 0 && (((pIVar1->IO).KeyShift & 1U) == 0)) &&
         (((pIVar1->IO).KeyAlt & 1U) == 0)))))) {
      if (((g._4_4_ & 2) != 0) && (((pIVar1->IO).MouseClicked[0] & 1U) != 0)) {
        SetActiveID(id,window_00);
        FocusWindow(window_00);
        IVar3 = operator-(&(pIVar1->IO).MousePos,&bb->Min);
        pIVar1->ActiveIdClickOffset = IVar3;
      }
      if ((((g._4_4_ & 4) != 0) && (((pIVar1->IO).MouseClicked[0] & 1U) != 0)) ||
         (((g._4_4_ & 0x10) != 0 && (((pIVar1->IO).MouseDoubleClicked[0] & 1U) != 0)))) {
        bb_local._7_1_ = true;
        SetActiveID(0,(ImGuiWindow *)0x0);
        FocusWindow(window_00);
      }
      if (((g._4_4_ & 8) != 0) && (((pIVar1->IO).MouseReleased[0] & 1U) != 0)) {
        if (((g._4_4_ & 1) == 0) ||
           ((pIVar1->IO).MouseDownDurationPrev[0] < (pIVar1->IO).KeyRepeatDelay)) {
          bb_local._7_1_ = true;
        }
        SetActiveID(0,(ImGuiWindow *)0x0);
      }
      if (((((g._4_4_ & 1) != 0) && (pIVar1->ActiveId == id)) &&
          (0.0 < (pIVar1->IO).MouseDownDuration[0])) && (bVar2 = IsMouseClicked(0,true), bVar2)) {
        bb_local._7_1_ = true;
      }
    }
    local_55 = false;
    if (pIVar1->ActiveId == id) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        if (((local_4a) && ((g._4_4_ & 2) != 0)) &&
           (((g._4_4_ & 1) == 0 ||
            ((pIVar1->IO).MouseDownDurationPrev[0] < (pIVar1->IO).KeyRepeatDelay)))) {
          bb_local._7_1_ = true;
        }
        SetActiveID(0,(ImGuiWindow *)0x0);
      }
      else {
        local_55 = true;
      }
    }
    if (((local_4a) && ((g._4_4_ & 0x400) != 0)) &&
       ((pIVar1->HoveredIdPreviousFrame != id && (pIVar1->HoveredIdPreviousFrame != 0)))) {
      local_55 = false;
      bb_local._7_1_ = false;
      local_4a = false;
    }
    if (out_hovered != (bool *)0x0) {
      *out_hovered = local_4a;
    }
    if (out_held != (bool *)0x0) {
      *out_held = local_55;
    }
  }
  else {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar1->ActiveId == id) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
    bb_local._7_1_ = false;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) SetActiveID(0);
        return false;
    }

    if ((flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnRelease | ImGuiButtonFlags_PressedOnDoubleClick)) == 0)
        flags |= ImGuiButtonFlags_PressedOnClickRelease;

    bool pressed = false;
    bool hovered = IsHovered(bb, id, (flags & ImGuiButtonFlags_FlattenChilds) != 0);
    if (hovered)
    {
        SetHoveredID(id);
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            //                        | CLICKING        | HOLDING with ImGuiButtonFlags_Repeat
            // PressedOnClickRelease  |  <on release>*  |  <on repeat> <on repeat> .. (NOT on release)  <-- MOST COMMON! (*) only if both click/release were over bounds
            // PressedOnClick         |  <on click>     |  <on click> <on repeat> <on repeat> ..
            // PressedOnRelease       |  <on release>   |  <on repeat> <on repeat> .. (NOT on release)
            // PressedOnDoubleClick   |  <on dclick>    |  <on dclick> <on repeat> <on repeat> ..
            if ((flags & ImGuiButtonFlags_PressedOnClickRelease) && g.IO.MouseClicked[0])
            {
                SetActiveID(id, window); // Hold on ID
                FocusWindow(window);
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;
            }
            if (((flags & ImGuiButtonFlags_PressedOnClick) && g.IO.MouseClicked[0]) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[0]))
            {
                pressed = true;
                SetActiveID(0);
                FocusWindow(window);
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && g.IO.MouseReleased[0])
            {
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
                SetActiveID(0);
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above). 
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if ((flags & ImGuiButtonFlags_Repeat) && g.ActiveId == id && g.IO.MouseDownDuration[0] > 0.0f && IsMouseClicked(0, true))
                pressed = true;
        }
    }

    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.IO.MouseDown[0])
        {
            held = true;
        }
        else
        {
            if (hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease))
                if (!((flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[0] >= g.IO.KeyRepeatDelay))  // Repeat mode trumps <on release>
                    pressed = true;
            SetActiveID(0);
        }
    }

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowOverlapMode) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = pressed = held = false;

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}